

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoomCreateView.cpp
# Opt level: O0

void __thiscall RoomCreateView::display(RoomCreateView *this)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  int strength_00;
  RoomCreateUpdateForm *this_00;
  undefined4 extraout_var;
  Controller *this_01;
  View *pVVar5;
  allocator local_c9;
  string local_c8;
  string local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  Room room;
  bool video;
  bool audio;
  int strength;
  int roomNumber;
  RoomCreateView *this_local;
  
  std::operator<<((ostream *)&std::cout,"To create a room fill in the details asked below: \n");
  std::operator<<((ostream *)&std::cout,"Enter room number: ");
  iVar4 = Input::getInt();
  std::operator<<((ostream *)&std::cout,"Enter strength: ");
  strength_00 = Input::getInt();
  std::operator<<((ostream *)&std::cout,"Audio required? (y/n): ");
  cVar1 = Input::getChar();
  std::operator<<((ostream *)&std::cout,"Video required? (y/n): ");
  cVar2 = Input::getChar();
  this_00 = (RoomCreateUpdateForm *)operator_new(0x38);
  RoomCreateUpdateForm::RoomCreateUpdateForm
            (this_00,iVar4,strength_00,cVar1 == 'y',cVar2 == 'y',(Room *)0x0);
  (this->super_CreateView<Room>).form = (ModelForm<Room> *)this_00;
  bVar3 = Form::isValid(&((this->super_CreateView<Room>).form)->super_Form);
  if (bVar3) {
    iVar4 = (*(((this->super_CreateView<Room>).form)->super_Form)._vptr_Form[1])();
    Room::Room((Room *)local_48,(Room *)CONCAT44(extraout_var,iVar4));
    iVar4 = Room::getRoomNumber((Room *)local_48);
    std::__cxx11::to_string(&local_a8,iVar4);
    std::operator+(&local_88,"Room #",&local_a8);
    std::operator+(&local_68,&local_88," created successfully.\n");
    std::operator<<((ostream *)&std::cout,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_a8);
  }
  else {
    Form::printErrors(&((this->super_CreateView<Room>).form)->super_Form);
  }
  this_01 = Controller::getInstance();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c8,"admin-panel",&local_c9);
  pVVar5 = Controller::getView(this_01,&local_c8);
  View::response->view = pVVar5;
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return;
}

Assistant:

void RoomCreateView::display() {
    cout << "To create a room fill in the details asked below: \n";
    int roomNumber, strength;
    bool audio, video;
    cout << "Enter room number: ";
    roomNumber = Input::getInt();
    cout << "Enter strength: ";
    strength = Input::getInt();
    cout << "Audio required? (y/n): ";
    audio = (Input::getChar() == 'y');
    cout << "Video required? (y/n): ";
    video = (Input::getChar() == 'y');
    form = new RoomCreateUpdateForm(roomNumber, strength, audio, video);
    if (form->isValid()) {
        Room room = form->save();
        cout << "Room #" + to_string(room.getRoomNumber()) + " created successfully.\n";
    } else {
        form->printErrors();
    }
    response->view = Controller::getInstance().getView("admin-panel");
}